

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

IfGenerateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IfGenerateSyntax,slang::syntax::IfGenerateSyntax_const&>
          (BumpAllocator *this,IfGenerateSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  IfGenerateSyntax *pIVar7;
  long lVar8;
  Token *pTVar9;
  Token *pTVar10;
  byte bVar11;
  
  bVar11 = 0;
  pIVar7 = (IfGenerateSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IfGenerateSyntax *)this->endPtr < pIVar7 + 1) {
    pIVar7 = (IfGenerateSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(pIVar7 + 1);
  }
  (pIVar7->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pIVar7->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar7->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pIVar7->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar3 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pIVar7->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pIVar7->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (pIVar7->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pIVar7->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pIVar7->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (pIVar7->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pIVar7->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pIVar7->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pIVar7->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d2a10;
  pTVar9 = &args->keyword;
  pTVar10 = &pIVar7->keyword;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    uVar4 = pTVar9->field_0x2;
    NVar5.raw = (pTVar9->numFlags).raw;
    uVar6 = pTVar9->rawLen;
    pTVar10->kind = pTVar9->kind;
    pTVar10->field_0x2 = uVar4;
    pTVar10->numFlags = (NumericTokenFlags)NVar5.raw;
    pTVar10->rawLen = uVar6;
    pTVar9 = (Token *)&pTVar9[-(ulong)bVar11].info;
    pTVar10 = (Token *)&pTVar10[-(ulong)bVar11].info;
  }
  return pIVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }